

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::callValue(Executor *this,CallNode *node,string *name,Value *value)

{
  bool bVar1;
  __optional_ne_t<TypeName,_TypeName> _Var2;
  Context *this_00;
  char *__lhs;
  Context *pCVar3;
  Executor *this_01;
  element_type *peVar4;
  pointer pVVar5;
  int __flags;
  long *in_RCX;
  void *__child_stack;
  void *__child_stack_00;
  long *in_RSI;
  shared_ptr<ExpressionNode> *in_RDI;
  Context *in_R8;
  Executor functionExecutor;
  __single_object argSymbol;
  shared_ptr<ExpressionNode> argValue;
  TypeName type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argName;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
  *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *__range1;
  const_iterator it;
  Context newContext;
  size_type nProvidedArgs;
  size_type nExpectedArgs;
  FunctionValueAnalyser valueAnalyser;
  Executor *in_stack_fffffffffffffa38;
  Executor *in_stack_fffffffffffffa40;
  undefined7 in_stack_fffffffffffffa48;
  undefined1 in_stack_fffffffffffffa4f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa80;
  FunctionValueAnalyser *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  string *in_stack_fffffffffffffab8;
  Context *in_stack_fffffffffffffac0;
  undefined1 local_528 [352];
  Node *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  Context local_2e8;
  long local_290 [2];
  TypeName local_27c;
  string local_278 [32];
  reference local_258;
  _Self local_250;
  _Self local_248;
  Context *local_240;
  _List_const_iterator<std::shared_ptr<ExpressionNode>_> local_238;
  Context local_230 [4];
  size_type local_e0;
  size_type local_d8;
  FunctionValueAnalyser local_c0;
  long *local_20;
  long *local_10;
  
  __args_1 = &local_c0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  FunctionValueAnalyser::FunctionValueAnalyser((FunctionValueAnalyser *)in_stack_fffffffffffffa40);
  (**(code **)(*local_20 + 0x18))(local_20,__args_1);
  this_00 = (Context *)FunctionValueAnalyser::getArguments_abi_cxx11_(&local_c0);
  std::
  optional<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>_>
  ::operator->((optional<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>_>
                *)0x18b23c);
  local_d8 = std::__cxx11::
             list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
             ::size((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                     *)in_stack_fffffffffffffa40);
  __lhs = (char *)(**(code **)(*local_10 + 0x18))();
  local_e0 = std::__cxx11::
             list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
             ::size((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                     *)in_stack_fffffffffffffa40);
  if (local_d8 == local_e0) {
    FunctionValueAnalyser::getContext(&local_c0);
    pCVar3 = std::optional<Context>::operator->((optional<Context> *)0x18b4e5);
    Context::clone(local_230,(__fn *)pCVar3,__child_stack,(int)in_RCX,in_R8);
    Context::enterScope(this_00);
    (**(code **)(*local_10 + 0x18))();
    local_238._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
         begin((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)in_stack_fffffffffffffa38);
    this_01 = (Executor *)FunctionValueAnalyser::getArguments_abi_cxx11_(&local_c0);
    pCVar3 = (Context *)
             std::
             optional<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>_>
             ::value((optional<std::__cxx11::list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>_>
                      *)in_stack_fffffffffffffa40);
    local_240 = pCVar3;
    local_248._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
         ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                  *)in_stack_fffffffffffffa38);
    local_250._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
         ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                *)in_stack_fffffffffffffa38);
    while( true ) {
      __flags = (int)in_RCX;
      bVar1 = std::operator!=(&local_248,&local_250);
      if (!bVar1) break;
      local_258 = std::
                  _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
                  ::operator*((_List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
                               *)in_stack_fffffffffffffa40);
      std::__cxx11::string::string(local_278,(string *)local_258);
      local_27c = local_258->second;
      std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*
                ((_List_const_iterator<std::shared_ptr<ExpressionNode>_> *)in_stack_fffffffffffffa40
                );
      std::shared_ptr<ExpressionNode>::shared_ptr
                ((shared_ptr<ExpressionNode> *)in_stack_fffffffffffffa40,
                 (shared_ptr<ExpressionNode> *)in_stack_fffffffffffffa38);
      Context::clone(&local_2e8,(__fn *)local_230,__child_stack_00,__flags,in_R8);
      in_RCX = local_290;
      in_R8 = &local_2e8;
      std::
      make_unique<RuntimeVariableSymbol,std::__cxx11::string_const&,TypeName_const&,std::shared_ptr<ExpressionNode>&,Context>
                (in_stack_fffffffffffffaa8,(TypeName *)__args_1,in_RDI,this_00);
      Context::~Context((Context *)0x18b658);
      std::shared_ptr<RuntimeSymbol>::
      shared_ptr<RuntimeVariableSymbol,std::default_delete<RuntimeVariableSymbol>,void>
                ((shared_ptr<RuntimeSymbol> *)in_stack_fffffffffffffa40,
                 (unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_> *)
                 in_stack_fffffffffffffa38);
      Context::addSymbol(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                         (shared_ptr<RuntimeSymbol> *)
                         CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
      std::shared_ptr<RuntimeSymbol>::~shared_ptr((shared_ptr<RuntimeSymbol> *)0x18b69b);
      std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator++(&local_238);
      std::unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_>::
      ~unique_ptr((unique_ptr<RuntimeVariableSymbol,_std::default_delete<RuntimeVariableSymbol>_> *)
                  in_stack_fffffffffffffa40);
      std::shared_ptr<ExpressionNode>::~shared_ptr((shared_ptr<ExpressionNode> *)0x18b6c2);
      std::__cxx11::string::~string(local_278);
      std::
      _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>
      ::operator++(&local_248);
    }
    Executor(this_01,pCVar3);
    FunctionValueAnalyser::getBody(&local_c0);
    peVar4 = std::__shared_ptr_access<BlockNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<BlockNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x18b7cb);
    (*(peVar4->super_StatementNode).super_Node._vptr_Node[2])(peVar4,local_528);
    Context::leaveScope((Context *)0x18b7ee);
    getStandardOut_abi_cxx11_(in_stack_fffffffffffffa38);
    std::operator<<((ostream *)(in_RDI + 0xb),(string *)&stack0xfffffffffffffab8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffab8);
    FunctionValueAnalyser::getReturnType(&local_c0);
    _Var2 = std::operator!=((optional<TypeName> *)in_stack_fffffffffffffa40,
                            (TypeName *)in_stack_fffffffffffffa38);
    if (_Var2) {
      in_stack_fffffffffffffa40 = (Executor *)getValue((Executor *)local_528);
      pVVar5 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                         ((unique_ptr<Value,_std::default_delete<Value>_> *)0x18b894);
      (*pVVar5->_vptr_Value[2])(&stack0xfffffffffffffaa8);
      std::unique_ptr<Value,_std::default_delete<Value>_>::operator=
                ((unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_fffffffffffffa40,
                 (unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_fffffffffffffa38);
      std::unique_ptr<Value,_std::default_delete<Value>_>::~unique_ptr
                ((unique_ptr<Value,_std::default_delete<Value>_> *)in_stack_fffffffffffffa40);
    }
    ~Executor(in_stack_fffffffffffffa40);
    Context::~Context((Context *)0x18b919);
    FunctionValueAnalyser::~FunctionValueAnalyser
              ((FunctionValueAnalyser *)in_stack_fffffffffffffa40);
    return;
  }
  std::operator+(__lhs,in_stack_fffffffffffffa80);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                 (char *)in_stack_fffffffffffffa40);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffa78);
  std::operator+(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                 (char *)in_stack_fffffffffffffa40);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffa78);
  std::operator+(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffa4f,in_stack_fffffffffffffa48),
                 (char *)in_stack_fffffffffffffa40);
  reportError(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
}

Assistant:

void Executor::callValue(const CallNode& node, const std::string& name, const Value& value)
{
  auto valueAnalyser = FunctionValueAnalyser{};
  value.accept(valueAnalyser);

  const auto nExpectedArgs = valueAnalyser.getArguments()->size();
  const auto nProvidedArgs = node.getArguments().size();
  if(nExpectedArgs != nProvidedArgs)
    reportError("Function " + name + " expected " +
                std::to_string(nExpectedArgs) + ", but got " + std::to_string(nProvidedArgs) + " arguments!", node);

  Context newContext = valueAnalyser.getContext()->clone();

  newContext.enterScope();

  auto it = node.getArguments().begin();
  for (const auto &arg : valueAnalyser.getArguments().value())
  {
    const auto argName = arg.first;
    const auto type = arg.second;
    std::shared_ptr<ExpressionNode> argValue = *it;
    auto argSymbol = std::make_unique<RuntimeVariableSymbol>(argName, type, argValue, newContext.clone());
    newContext.addSymbol(argName, std::move(argSymbol));

    ++it;
  }

  Executor functionExecutor{newContext};
  valueAnalyser.getBody()->accept(functionExecutor);

  newContext.leaveScope();

  stdout_ << functionExecutor.getStandardOut();
  if (valueAnalyser.getReturnType() != TypeName::Void)
  {
    value_ = functionExecutor.getValue()->clone();
  }
}